

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

void polyscope::view::setViewFromJson(string *jsonData,bool flyTo)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *__s2;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar1;
  bool bVar2;
  reference pvVar3;
  ulong uVar4;
  reference j_00;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *paVar5;
  internal_iterator *piVar6;
  undefined8 *puVar7;
  ulong uVar8;
  int i;
  int iVar9;
  undefined7 in_register_00000031;
  long lVar10;
  int j_1;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar11;
  long lVar12;
  json j;
  iterator result;
  float ret;
  value_type matData;
  mat4 newViewMat;
  stringstream s;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_340;
  undefined1 local_330 [23];
  undefined1 auStack_319 [4];
  undefined1 uStack_315;
  uint uStack_314;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 local_310;
  undefined4 uStack_30c;
  undefined1 *local_308;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 local_300 [5];
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 local_2ec;
  double local_2e8;
  double local_2e0;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_2d8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2b8;
  undefined4 local_2a8;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 local_2a4;
  double local_2a0;
  key_type local_298;
  key_type local_278;
  key_type local_258;
  key_type local_238;
  key_type local_218;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  aVar1 = windowHeight;
  aVar11 = windowWidth;
  local_340.m_type = null;
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)jsonData,_S_out|_S_in);
  nlohmann::operator>>((istream *)local_1b8,&local_340);
  local_2ec = aVar1;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&local_340,"viewMat");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_2b8,pvVar3);
  uVar4 = (ulong)local_2b8.m_type;
  uVar8 = uVar4;
  if (uVar4 != 0) {
    if (local_2b8.m_type == object) {
      uVar8 = *(size_t *)((long)&(local_2b8.m_value.object)->_M_t + 0x28);
    }
    else if (local_2b8.m_type == array) {
      uVar8 = (long)*(pointer *)
                     ((long)&(local_2b8.m_value.array)->
                             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     + 8) -
              *(long *)&(local_2b8.m_value.array)->
                        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
              >> 4;
    }
    else {
      uVar8 = 1;
    }
  }
  if (uVar8 != 0x10) {
    local_2e0 = -777.0;
    local_2a0 = -777.0;
    local_2e8 = -777.0;
    goto LAB_001fd684;
  }
  local_2d8.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
  local_2d8.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_2d8.m_it.primitive_iterator.m_it = 0;
  if (local_2b8.m_type == object) {
    piVar6 = &local_2d8.m_it;
  }
  else if (local_2b8.m_type == array) {
    piVar6 = (internal_iterator *)&local_2d8.m_it.array_iterator;
  }
  else {
    piVar6 = (internal_iterator *)&local_2d8.m_it.primitive_iterator;
  }
  (piVar6->object_iterator)._M_node = (_Base_ptr)0x0;
  local_2a8 = (undefined4)CONCAT71(in_register_00000031,flyTo);
  local_2a4 = aVar11;
  if (uVar4 == 0) {
    local_2d8.m_it.primitive_iterator.m_it = 1;
  }
  else if (local_2b8.m_type == array) {
    local_2d8.m_it.array_iterator._M_current =
         *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           **)&(local_2b8.m_value.array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    ;
  }
  else if (local_2b8.m_type == object) {
    local_2d8.m_it.object_iterator._M_node =
         *(_Base_ptr *)((long)&(local_2b8.m_value.object)->_M_t + 0x18);
  }
  else {
    local_2d8.m_it.primitive_iterator.m_it = 0;
  }
  iVar9 = 0;
  local_2d8.m_object = &local_2b8;
  do {
    lVar10 = 0;
    lVar12 = 0;
    do {
      j_00 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator*(&local_2d8);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
                (j_00,&local_310.y);
      if (iVar9 == 1) {
        paVar5 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)&local_1f8 +
                 lVar12 * 4 + 1;
      }
      else if (iVar9 == 2) {
        paVar5 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)&local_1f8 +
                 (lVar12 * 2 + 1) * 2;
      }
      else if (iVar9 == 3) {
        paVar5 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)&local_1f8 +
                 lVar12 * 4 + 3;
      }
      else {
        paVar5 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)
                 ((long)&local_1f8 + lVar10);
      }
      *paVar5 = local_310;
      if ((local_2d8.m_object)->m_type == array) {
        local_2d8.m_it.array_iterator._M_current = local_2d8.m_it.array_iterator._M_current + 1;
      }
      else if ((local_2d8.m_object)->m_type == object) {
        local_2d8.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_2d8.m_it.object_iterator._M_node);
      }
      else {
        local_2d8.m_it.primitive_iterator.m_it = local_2d8.m_it.primitive_iterator.m_it + 1;
      }
      lVar12 = lVar12 + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x40);
    iVar9 = iVar9 + 1;
  } while (iVar9 != 4);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&local_340,"fov");
  nlohmann::detail::
  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
            (pvVar3,(double *)&local_310.y);
  local_2a0 = (double)CONCAT44(uStack_30c,local_310);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"nearClipRatio","");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::find((iterator *)&local_310,&local_340,&local_218);
  local_330._8_8_ = (_Base_ptr)0x0;
  local_330._16_7_ = 0;
  auStack_319[0] = 0;
  auStack_319._1_3_ = 0;
  uStack_315 = 0;
  uStack_314 = 0;
  if (local_340.m_type == object) {
    puVar7 = (undefined8 *)(local_330 + 8);
  }
  else if (local_340.m_type == array) {
    puVar7 = (undefined8 *)(local_330 + 0x10);
  }
  else {
    puVar7 = (undefined8 *)(auStack_319 + 1);
  }
  *puVar7 = 0;
  if (local_340.m_type == array) {
    local_330._16_7_ = (undefined7)(local_340.m_value.string)->_M_string_length;
    auStack_319[0] = (undefined1)((local_340.m_value.string)->_M_string_length >> 0x38);
  }
  else if (local_340.m_type == object) {
    local_330._8_8_ = &((local_340.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
  }
  else {
    auStack_319._1_3_ = 1;
    uStack_315 = 0;
    uStack_314 = 0;
  }
  local_330._0_8_ = &local_340;
  bVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_310,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if (bVar2) {
    local_2e0 = -777.0;
  }
  else {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_340,"nearClipRatio");
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
              (pvVar3,(double *)&local_310.y);
    local_2e0 = (double)CONCAT44(uStack_30c,local_310);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"farClipRatio","");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::find((iterator *)&local_310,&local_340,&local_238);
  local_330._8_8_ = (_Base_ptr)0x0;
  local_330._16_7_ = 0;
  auStack_319[0] = 0;
  auStack_319._1_3_ = 0;
  uStack_315 = 0;
  uStack_314 = 0;
  if (local_340.m_type == object) {
    puVar7 = (undefined8 *)(local_330 + 8);
  }
  else if (local_340.m_type == array) {
    puVar7 = (undefined8 *)(local_330 + 0x10);
  }
  else {
    puVar7 = (undefined8 *)(auStack_319 + 1);
  }
  *puVar7 = 0;
  if (local_340.m_type == array) {
    local_330._16_7_ = (undefined7)(local_340.m_value.string)->_M_string_length;
    auStack_319[0] = (undefined1)((local_340.m_value.string)->_M_string_length >> 0x38);
  }
  else if (local_340.m_type == object) {
    local_330._8_8_ = &((local_340.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
  }
  else {
    auStack_319._1_3_ = 1;
    uStack_315 = 0;
    uStack_314 = 0;
  }
  local_330._0_8_ = &local_340;
  bVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_310,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if (bVar2) {
    local_2e8 = -777.0;
  }
  else {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_340,"farClipRatio");
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
              (pvVar3,(double *)&local_310.y);
    local_2e8 = (double)CONCAT44(uStack_30c,local_310);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"windowWidth","");
  aVar11 = local_2a4;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::find((iterator *)&local_310,&local_340,&local_258);
  local_330._8_8_ = (_Base_ptr)0x0;
  local_330._16_7_ = 0;
  auStack_319[0] = 0;
  auStack_319._1_3_ = 0;
  uStack_315 = 0;
  uStack_314 = 0;
  if (local_340.m_type == object) {
    puVar7 = (undefined8 *)(local_330 + 8);
  }
  else if (local_340.m_type == array) {
    puVar7 = (undefined8 *)(local_330 + 0x10);
  }
  else {
    puVar7 = (undefined8 *)(auStack_319 + 1);
  }
  *puVar7 = 0;
  if (local_340.m_type == array) {
    local_330._16_7_ = (undefined7)(local_340.m_value.string)->_M_string_length;
    auStack_319[0] = (undefined1)((local_340.m_value.string)->_M_string_length >> 0x38);
  }
  else if (local_340.m_type == object) {
    local_330._8_8_ = &((local_340.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
  }
  else {
    auStack_319._1_3_ = 1;
    uStack_315 = 0;
    uStack_314 = 0;
  }
  local_330._0_8_ = &local_340;
  bVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_310,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (!bVar2) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_340,"windowWidth");
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
              (pvVar3,(int *)&local_310);
    aVar11 = local_310;
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"windowHeight","");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::find((iterator *)&local_310,&local_340,&local_278);
  local_330._8_8_ = (_Base_ptr)0x0;
  local_330._16_7_ = 0;
  auStack_319[0] = 0;
  auStack_319._1_3_ = 0;
  uStack_315 = 0;
  uStack_314 = 0;
  if (local_340.m_type == object) {
    puVar7 = (undefined8 *)(local_330 + 8);
  }
  else if (local_340.m_type == array) {
    puVar7 = (undefined8 *)(local_330 + 0x10);
  }
  else {
    puVar7 = (undefined8 *)(auStack_319 + 1);
  }
  *puVar7 = 0;
  if (local_340.m_type == array) {
    local_330._16_7_ = (undefined7)(local_340.m_value.string)->_M_string_length;
    auStack_319[0] = (undefined1)((local_340.m_value.string)->_M_string_length >> 0x38);
  }
  else if (local_340.m_type == object) {
    local_330._8_8_ = &((local_340.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
  }
  else {
    auStack_319._1_3_ = 1;
    uStack_315 = 0;
    uStack_314 = 0;
  }
  local_330._0_8_ = &local_340;
  bVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_310,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (!bVar2) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&local_340,"windowHeight");
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
              (pvVar3,(int *)&local_310);
    local_2ec = local_310;
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"projectionMode","");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::find((iterator *)&local_310,&local_340,&local_298);
  local_330._8_8_ = (_Base_ptr)0x0;
  local_330._16_7_ = 0;
  auStack_319 = (undefined1  [4])0x0;
  uStack_315 = 0;
  uStack_314 = 0;
  if (local_340.m_type == object) {
    puVar7 = (undefined8 *)(local_330 + 8);
  }
  else if (local_340.m_type == array) {
    puVar7 = (undefined8 *)(local_330 + 0x10);
  }
  else {
    puVar7 = (undefined8 *)(auStack_319 + 1);
  }
  *puVar7 = 0;
  if (local_340.m_type == array) {
    local_330._16_7_ = (undefined7)(local_340.m_value.string)->_M_string_length;
    auStack_319[0] = (undefined1)((local_340.m_value.string)->_M_string_length >> 0x38);
  }
  else if (local_340.m_type == object) {
    local_330._8_8_ = &((local_340.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
  }
  else {
    auStack_319._1_3_ = 1;
    uStack_315 = 0;
    uStack_314 = 0;
  }
  local_330._0_8_ = &local_340;
  bVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_310,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  flyTo = SUB41(local_2a8,0);
  if (bVar2) goto LAB_001fd684;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&local_340,"projectionMode");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_310,pvVar3)
  ;
  __s2 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)(local_330 + 0x10);
  local_330._16_7_ = 0x63657073726550;
  auStack_319 = (undefined1  [4])0x65766974;
  local_330._8_8_ = (_Base_ptr)0xb;
  uStack_315 = 0;
  if (local_308 == (undefined1 *)0xb) {
    local_330._0_8_ = __s2;
    iVar9 = bcmp((void *)CONCAT44(uStack_30c,local_310),__s2,0xb);
    if (iVar9 != 0) goto LAB_001fd60f;
    projectionMode = 0;
  }
  else {
LAB_001fd60f:
    local_330._16_7_ = 0x72676f6874724f;
    auStack_319 = (undefined1  [4])0x69687061;
    uStack_315 = 99;
    local_330._8_8_ = &DAT_0000000c;
    uStack_314 = uStack_314 & 0xffffff00;
    local_330._0_8_ = __s2;
    if (local_308 == &DAT_0000000c) {
      iVar9 = bcmp((void *)CONCAT44(uStack_30c,local_310),__s2,0xc);
      if (iVar9 == 0) {
        projectionMode = 1;
      }
    }
  }
  if ((anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)
      CONCAT44(uStack_30c,local_310) != local_300) {
    operator_delete((anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)
                    CONCAT44(uStack_30c,local_310));
  }
LAB_001fd684:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_2b8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_340);
  if (uVar8 == 0x10) {
    windowHeight = local_2ec;
    windowWidth = aVar11;
    bVar2 = isInitialized();
    if (bVar2) {
      (**(code **)(*render::engine + 0x98))();
    }
    if (0.0 < local_2e0) {
      nearClipRatio = local_2e0;
    }
    if (0.0 < local_2e8) {
      farClipRatio = local_2e8;
    }
    if (flyTo == false) {
      _viewMat = local_1f8;
      DAT_006006ac = uStack_1f0;
      DAT_006006b4 = uStack_1e8;
      _DAT_006006bc = uStack_1e0;
      DAT_006006c4 = uStack_1d8;
      DAT_006006cc = uStack_1d0;
      DAT_006006d4 = uStack_1c8;
      DAT_006006dc = uStack_1c0;
      fov = local_2a0;
      requestRedraw();
    }
    else {
      startFlightTo((mat4 *)&local_1f8,(float)fov,0.4);
    }
  }
  return;
}

Assistant:

void setViewFromJson(std::string jsonData, bool flyTo) {
  // Values will go here
  glm::mat4 newViewMat;
  double newFov = -777;
  double newNearClipRatio = -777;
  double newFarClipRatio = -777;

  int windowWidth = view::windowWidth;
  int windowHeight = view::windowHeight;

  try {

    // Deserialize
    json j;
    std::stringstream s(jsonData);
    s >> j;

    // Read out the data
    auto matData = j["viewMat"];
    if (matData.size() != 16) return; // check size
    auto it = matData.begin();
    for (int i = 0; i < 4; i++) {
      for (int j = 0; j < 4; j++) {
        newViewMat[j][i] = *it;
        it++;
      }
    }
    newFov = j["fov"];

    // Get the clip ratios, but only if present
    if (j.find("nearClipRatio") != j.end()) {
      newNearClipRatio = j["nearClipRatio"];
    }
    if (j.find("farClipRatio") != j.end()) {
      newFarClipRatio = j["farClipRatio"];
    }

    // Get the window sizes, if present
    if (j.find("windowWidth") != j.end()) {
      windowWidth = j["windowWidth"];
    }
    if (j.find("windowHeight") != j.end()) {
      windowHeight = j["windowHeight"];
    }

    if (j.find("projectionMode") != j.end()) {
      std::string projectionModeStr = j["projectionMode"];
      if (projectionModeStr == to_string(ProjectionMode::Perspective)) {
        view::projectionMode = ProjectionMode::Perspective;
      } else if (projectionModeStr == to_string(ProjectionMode::Orthographic)) {
        view::projectionMode = ProjectionMode::Orthographic;
      }
    }

  } catch (...) {
    // If anything goes wrong parsing, just give up
    return;
  }

  // === Assign the new values

  view::setWindowSize(windowWidth, windowHeight);

  if (newNearClipRatio > 0) nearClipRatio = newNearClipRatio;
  if (newFarClipRatio > 0) farClipRatio = newFarClipRatio;

  if (flyTo) {
    startFlightTo(newViewMat, fov);
  } else {
    viewMat = newViewMat;
    fov = newFov;
    requestRedraw();
  }
}